

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void leveldb::AppendEscapedStringTo(string *str,Slice *value)

{
  byte bVar1;
  size_t i;
  ulong n;
  char buf [10];
  
  for (n = 0; n < value->size_; n = n + 1) {
    bVar1 = Slice::operator[](value,n);
    if ((byte)(bVar1 - 0x20) < 0x5f) {
      std::__cxx11::string::push_back((char)str);
    }
    else {
      snprintf(buf,10,"\\x%02x",(ulong)bVar1);
      std::__cxx11::string::append((char *)str);
    }
  }
  return;
}

Assistant:

void AppendEscapedStringTo(std::string* str, const Slice& value) {
  for (size_t i = 0; i < value.size(); i++) {
    char c = value[i];
    if (c >= ' ' && c <= '~') {
      str->push_back(c);
    } else {
      char buf[10];
      snprintf(buf, sizeof(buf), "\\x%02x",
               static_cast<unsigned int>(c) & 0xff);
      str->append(buf);
    }
  }
}